

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_uint32_t ktxTexture2_calcRequiredLevelAlignment(ktxTexture2 *This)

{
  uint32_t uVar1;
  
  if (This->supercompressionScheme != KTX_SS_BEGIN_RANGE) {
    return 1;
  }
  uVar1 = lcm4((This->_protected->_formatSize).blockSizeInBits >> 3);
  return uVar1;
}

Assistant:

ktx_uint32_t
 ktxTexture2_calcRequiredLevelAlignment(ktxTexture2* This)
 {
    ktx_uint32_t alignment;
    if (This->supercompressionScheme != KTX_SS_NONE)
        alignment = 1;
    else
        alignment = lcm4(This->_protected->_formatSize.blockSizeInBits / 8);
    return alignment;
 }